

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::IntegrationTest_doesNotExposeAnythingOnDefaultPath_Test::
~IntegrationTest_doesNotExposeAnythingOnDefaultPath_Test
          (IntegrationTest_doesNotExposeAnythingOnDefaultPath_Test *this)

{
  IntegrationTest_doesNotExposeAnythingOnDefaultPath_Test *this_local;
  
  ~IntegrationTest_doesNotExposeAnythingOnDefaultPath_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(IntegrationTest, doesNotExposeAnythingOnDefaultPath) {
  const auto metrics = FetchMetrics(default_metrics_path_);

  EXPECT_GE(metrics.code, 400);
}